

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O2

void jsimd_h2v2_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  JSAMPLE JVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ushort *puVar9;
  JSAMPARRAY ppJVar10;
  ushort *puVar11;
  ulong uVar12;
  JSAMPROW pJVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  
  uVar12 = (ulong)cinfo->image_width;
  uVar8 = (ulong)(uint)cinfo->max_v_samp_factor;
  uVar4 = (ulong)(uint)compptr->v_samp_factor;
  uVar5 = (ulong)compptr->width_in_blocks;
  if (((byte)simd_support & 0x80) == 0) {
    if (uVar5 != 0) {
      lVar6 = uVar5 * 0x10 - uVar12;
      if ((lVar6 != 0 && uVar12 <= uVar5 * 0x10) && (ppJVar10 = input_data, uVar8 != 0)) {
        do {
          JVar1 = (*ppJVar10 + uVar12)[-1];
          pJVar13 = *ppJVar10 + uVar12;
          for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
            *pJVar13 = JVar1;
            pJVar13 = pJVar13 + 1;
          }
          uVar3 = uVar8 - 1;
          bVar2 = 0 < (long)uVar8;
          uVar8 = uVar3;
          ppJVar10 = ppJVar10 + 1;
        } while (uVar3 != 0 && bVar2);
      }
      if (uVar4 != 0) {
        do {
          puVar9 = (ushort *)*input_data;
          puVar11 = (ushort *)input_data[1];
          pJVar13 = *output_data;
          uVar8 = uVar5 << 3;
          if (0xf < uVar5 << 3) goto jsimd_h2v2_downsample_sse2_columnloop;
          do {
            uVar14 = *puVar9;
            uVar15 = puVar9[1];
            uVar16 = puVar9[2];
            uVar17 = puVar9[3];
            uVar18 = puVar9[4];
            uVar19 = puVar9[5];
            uVar20 = puVar9[6];
            uVar21 = puVar9[7];
            uVar23 = *puVar11;
            uVar25 = puVar11[1];
            uVar27 = puVar11[2];
            uVar29 = puVar11[3];
            uVar31 = puVar11[4];
            uVar33 = puVar11[5];
            uVar35 = puVar11[6];
            uVar37 = puVar11[7];
            uVar22 = 0;
            uVar24 = 0;
            uVar26 = 0;
            uVar28 = 0;
            uVar30 = 0;
            uVar32 = 0;
            uVar34 = 0;
            uVar36 = 0;
            uVar38 = 0;
            uVar39 = 0;
            uVar40 = 0;
            uVar41 = 0;
            uVar42 = 0;
            uVar43 = 0;
            uVar44 = 0;
            uVar45 = 0;
            uVar8 = 0x10;
            while( true ) {
              uVar14 = (ushort)((uVar14 & 0xff) + (uVar14 >> 8) + (uVar23 & 0xff) + (uVar23 >> 8) +
                               1) >> 2;
              uVar15 = (ushort)((uVar15 & 0xff) + (uVar15 >> 8) + (uVar25 & 0xff) + (uVar25 >> 8) +
                               2) >> 2;
              uVar16 = (ushort)((uVar16 & 0xff) + (uVar16 >> 8) + (uVar27 & 0xff) + (uVar27 >> 8) +
                               1) >> 2;
              uVar17 = (ushort)((uVar17 & 0xff) + (uVar17 >> 8) + (uVar29 & 0xff) + (uVar29 >> 8) +
                               2) >> 2;
              uVar18 = (ushort)((uVar18 & 0xff) + (uVar18 >> 8) + (uVar31 & 0xff) + (uVar31 >> 8) +
                               1) >> 2;
              uVar19 = (ushort)((uVar19 & 0xff) + (uVar19 >> 8) + (uVar33 & 0xff) + (uVar33 >> 8) +
                               2) >> 2;
              uVar20 = (ushort)((uVar20 & 0xff) + (uVar20 >> 8) + (uVar35 & 0xff) + (uVar35 >> 8) +
                               1) >> 2;
              uVar21 = (ushort)((uVar21 & 0xff) + (uVar21 >> 8) + (uVar37 & 0xff) + (uVar37 >> 8) +
                               2) >> 2;
              uVar23 = (ushort)((uVar22 & 0xff) + (uVar22 >> 8) + (uVar38 & 0xff) + (uVar38 >> 8) +
                               1) >> 2;
              uVar25 = (ushort)((uVar24 & 0xff) + (uVar24 >> 8) + (uVar39 & 0xff) + (uVar39 >> 8) +
                               2) >> 2;
              uVar27 = (ushort)((uVar26 & 0xff) + (uVar26 >> 8) + (uVar40 & 0xff) + (uVar40 >> 8) +
                               1) >> 2;
              uVar29 = (ushort)((uVar28 & 0xff) + (uVar28 >> 8) + (uVar41 & 0xff) + (uVar41 >> 8) +
                               2) >> 2;
              uVar31 = (ushort)((uVar30 & 0xff) + (uVar30 >> 8) + (uVar42 & 0xff) + (uVar42 >> 8) +
                               1) >> 2;
              uVar33 = (ushort)((uVar32 & 0xff) + (uVar32 >> 8) + (uVar43 & 0xff) + (uVar43 >> 8) +
                               2) >> 2;
              uVar35 = (ushort)((uVar34 & 0xff) + (uVar34 >> 8) + (uVar44 & 0xff) + (uVar44 >> 8) +
                               1) >> 2;
              uVar37 = (ushort)((uVar36 & 0xff) + (uVar36 >> 8) + (uVar45 & 0xff) + (uVar45 >> 8) +
                               2) >> 2;
              *pJVar13 = (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar14 - (0xff < uVar14);
              pJVar13[1] = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
              pJVar13[2] = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16);
              pJVar13[3] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
              pJVar13[4] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
              pJVar13[5] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
              pJVar13[6] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
              pJVar13[7] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
              pJVar13[8] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
              pJVar13[9] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
              pJVar13[10] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
              pJVar13[0xb] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
              pJVar13[0xc] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
              pJVar13[0xd] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
              pJVar13[0xe] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
              pJVar13[0xf] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
              uVar8 = uVar8 - 0x10;
              puVar9 = puVar9 + 0x10;
              puVar11 = puVar11 + 0x10;
              pJVar13 = pJVar13 + 0x10;
              if (uVar8 < 0x10) break;
jsimd_h2v2_downsample_sse2_columnloop:
              uVar14 = *puVar9;
              uVar15 = puVar9[1];
              uVar16 = puVar9[2];
              uVar17 = puVar9[3];
              uVar18 = puVar9[4];
              uVar19 = puVar9[5];
              uVar20 = puVar9[6];
              uVar21 = puVar9[7];
              uVar23 = *puVar11;
              uVar25 = puVar11[1];
              uVar27 = puVar11[2];
              uVar29 = puVar11[3];
              uVar31 = puVar11[4];
              uVar33 = puVar11[5];
              uVar35 = puVar11[6];
              uVar37 = puVar11[7];
              uVar22 = puVar9[8];
              uVar24 = puVar9[9];
              uVar26 = puVar9[10];
              uVar28 = puVar9[0xb];
              uVar30 = puVar9[0xc];
              uVar32 = puVar9[0xd];
              uVar34 = puVar9[0xe];
              uVar36 = puVar9[0xf];
              uVar38 = puVar11[8];
              uVar39 = puVar11[9];
              uVar40 = puVar11[10];
              uVar41 = puVar11[0xb];
              uVar42 = puVar11[0xc];
              uVar43 = puVar11[0xd];
              uVar44 = puVar11[0xe];
              uVar45 = puVar11[0xf];
            }
          } while (uVar8 != 0);
          input_data = input_data + 2;
          output_data = output_data + 1;
          uVar8 = uVar4 - 1;
          bVar2 = 0 < (long)uVar4;
          uVar4 = uVar8;
        } while (uVar8 != 0 && bVar2);
      }
    }
    return;
  }
  jsimd_h2v2_downsample_avx2();
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v2_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                      JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_h2v2_downsample_avx2(cinfo->image_width, cinfo->max_v_samp_factor,
                               compptr->v_samp_factor,
                               compptr->width_in_blocks, input_data,
                               output_data);
  else
    jsimd_h2v2_downsample_sse2(cinfo->image_width, cinfo->max_v_samp_factor,
                               compptr->v_samp_factor,
                               compptr->width_in_blocks, input_data,
                               output_data);
}